

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_trie.c
# Opt level: O1

int32 ngram_model_trie_raw_score
                (ngram_model_t *base,int32 wid,int32 *hist,int32 n_hist,int32 *n_used)

{
  byte bVar1;
  ulong uVar2;
  ngram_model_trie_t *model;
  ulong uVar3;
  float fVar4;
  
  bVar1 = base->n;
  uVar3 = (ulong)(bVar1 - 1);
  if (n_hist < (int)(uint)bVar1) {
    uVar3 = (ulong)(uint)n_hist;
  }
  if (0 < (int)uVar3) {
    uVar2 = 0;
    do {
      if (hist[uVar2] < 0) {
        uVar3 = uVar2 & 0xffffffff;
        break;
      }
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  fVar4 = lm_trie_score(*(lm_trie_t **)(base + 1),(uint)bVar1,wid,hist,(int32)uVar3,n_used);
  return (int)fVar4;
}

Assistant:

static int32
ngram_model_trie_raw_score(ngram_model_t * base, int32 wid, int32 * hist,
                           int32 n_hist, int32 * n_used)
{
    int32 i;
    ngram_model_trie_t *model = (ngram_model_trie_t *) base;

    if (n_hist > model->base.n - 1)
        n_hist = model->base.n - 1;
    for (i = 0; i < n_hist; i++) {
        if (hist[i] < 0) {
            n_hist = i;
            break;
        }
    }

    return (int32) lm_trie_score(model->trie, model->base.n, wid, hist,
                                 n_hist, n_used);
}